

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall c4::yml::detail::ReferenceResolver::lookup_(ReferenceResolver *this,refdata *ra)

{
  NodeType_e NVar1;
  char *that;
  ulong sz;
  ulong uVar2;
  refdata *prVar3;
  Tree *pTVar4;
  ulong uVar5;
  code *pcVar6;
  bool bVar7;
  int iVar8;
  size_t sVar9;
  csubstr *pcVar10;
  NodeData *pNVar11;
  char errmsg [1024];
  char local_438 [24];
  char *pcStack_420;
  undefined8 local_418;
  
  NVar1 = (ra->type).type;
  if ((NVar1 & (VALREF|KEYREF)) == NOTYPE) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar6 = (code *)swi(3);
      sVar9 = (*pcVar6)();
      return sVar9;
    }
    local_438[0] = '\0';
    local_438[1] = '\0';
    local_438[2] = '\0';
    local_438[3] = '\0';
    local_438[4] = '\0';
    local_438[5] = '\0';
    local_438[6] = '\0';
    local_438[7] = '\0';
    local_438[8] = -0x1e;
    local_438[9] = 'f';
    local_438[10] = '\0';
    local_438[0xb] = '\0';
    local_438[0xc] = '\0';
    local_438[0xd] = '\0';
    local_438[0xe] = '\0';
    local_438[0xf] = '\0';
    local_438[0x10] = '\0';
    local_438[0x11] = '\0';
    local_438[0x12] = '\0';
    local_438[0x13] = '\0';
    local_438[0x14] = '\0';
    local_438[0x15] = '\0';
    local_438[0x16] = '\0';
    local_438[0x17] = '\0';
    pcStack_420 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_418 = 0x65;
    (*(code *)PTR_error_impl_00247a78)
              ("check failed: ra->type.is_key_ref() || ra->type.is_val_ref()",0x3c,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((char)NVar1 < '\0' == SUB41(((uint)NVar1 & 0x40) >> 6,0)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
      pcVar6 = (code *)swi(3);
      sVar9 = (*pcVar6)();
      return sVar9;
    }
    local_438[0] = '\0';
    local_438[1] = '\0';
    local_438[2] = '\0';
    local_438[3] = '\0';
    local_438[4] = '\0';
    local_438[5] = '\0';
    local_438[6] = '\0';
    local_438[7] = '\0';
    local_438[8] = -0x1d;
    local_438[9] = 'f';
    local_438[10] = '\0';
    local_438[0xb] = '\0';
    local_438[0xc] = '\0';
    local_438[0xd] = '\0';
    local_438[0xe] = '\0';
    local_438[0xf] = '\0';
    local_438[0x10] = '\0';
    local_438[0x11] = '\0';
    local_438[0x12] = '\0';
    local_438[0x13] = '\0';
    local_438[0x14] = '\0';
    local_438[0x15] = '\0';
    local_438[0x16] = '\0';
    local_438[0x17] = '\0';
    pcStack_420 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_418 = 0x65;
    (*(code *)PTR_error_impl_00247a78)
              ("check failed: ra->type.is_key_ref() != ra->type.is_val_ref()",0x3c,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((char)NVar1 < '\0') {
    pcVar10 = Tree::val_ref(this->t,ra->node);
  }
  else {
    if ((NVar1 & KEYREF) == NOTYPE) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar6 = (code *)swi(3);
        sVar9 = (*pcVar6)();
        return sVar9;
      }
      local_438[0] = '\0';
      local_438[1] = '\0';
      local_438[2] = '\0';
      local_438[3] = '\0';
      local_438[4] = '\0';
      local_438[5] = '\0';
      local_438[6] = '\0';
      local_438[7] = '\0';
      local_438[8] = -0x15;
      local_438[9] = 'f';
      local_438[10] = '\0';
      local_438[0xb] = '\0';
      local_438[0xc] = '\0';
      local_438[0xd] = '\0';
      local_438[0xe] = '\0';
      local_438[0xf] = '\0';
      local_438[0x10] = '\0';
      local_438[0x11] = '\0';
      local_438[0x12] = '\0';
      local_438[0x13] = '\0';
      local_438[0x14] = '\0';
      local_438[0x15] = '\0';
      local_438[0x16] = '\0';
      local_438[0x17] = '\0';
      pcStack_420 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_418 = 0x65;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: ra->type.is_key_ref()",0x23,
                 (anonymous_namespace)::s_default_callbacks);
    }
    pcVar10 = Tree::key_ref(this->t,ra->node);
  }
  that = pcVar10->str;
  sz = pcVar10->len;
  do {
    uVar2 = ra->prev_anchor;
    if (uVar2 == 0xffffffffffffffff) {
      snprintf(local_438,0x400,"anchor does not exist: \'%.*s\'",sz & 0xffffffff,that);
      (*(code *)PTR_error_impl_00247a78)(local_438,0x3ff,(anonymous_namespace)::s_default_callbacks)
      ;
      return 0xffffffffffffffff;
    }
    if ((this->refs).m_size <= uVar2) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar6 = (code *)swi(3);
        sVar9 = (*pcVar6)();
        return sVar9;
      }
      local_438[0] = '\0';
      local_438[1] = '\0';
      local_438[2] = '\0';
      local_438[3] = '\0';
      local_438[4] = '\0';
      local_438[5] = '\0';
      local_438[6] = '\0';
      local_438[7] = '\0';
      local_438[8] = 'h';
      local_438[9] = '\\';
      local_438[10] = '\0';
      local_438[0xb] = '\0';
      local_438[0xc] = '\0';
      local_438[0xd] = '\0';
      local_438[0xe] = '\0';
      local_438[0xf] = '\0';
      local_438[0x10] = '\0';
      local_438[0x11] = '\0';
      local_438[0x12] = '\0';
      local_438[0x13] = '\0';
      local_438[0x14] = '\0';
      local_438[0x15] = '\0';
      local_438[0x16] = '\0';
      local_438[0x17] = '\0';
      pcStack_420 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_418 = 0x65;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i < m_size",0x18,(anonymous_namespace)::s_default_callbacks);
    }
    prVar3 = (this->refs).m_stack;
    pTVar4 = this->t;
    uVar5 = prVar3[uVar2].node;
    if ((uVar5 == 0xffffffffffffffff) || (pTVar4->m_cap <= uVar5)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar6 = (code *)swi(3);
        sVar9 = (*pcVar6)();
        return sVar9;
      }
      local_438[0] = '\0';
      local_438[1] = '\0';
      local_438[2] = '\0';
      local_438[3] = '\0';
      local_438[4] = '\0';
      local_438[5] = '\0';
      local_438[6] = '\0';
      local_438[7] = '\0';
      local_438[8] = -0x7a;
      local_438[9] = 'K';
      local_438[10] = '\0';
      local_438[0xb] = '\0';
      local_438[0xc] = '\0';
      local_438[0xd] = '\0';
      local_438[0xe] = '\0';
      local_438[0xf] = '\0';
      local_438[0x10] = '\0';
      local_438[0x11] = '\0';
      local_438[0x12] = '\0';
      local_438[0x13] = '\0';
      local_438[0x14] = '\0';
      local_438[0x15] = '\0';
      local_438[0x16] = '\0';
      local_438[0x17] = '\0';
      pcStack_420 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_418 = 0x65;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    ra = prVar3 + uVar2;
    pNVar11 = pTVar4->m_buf;
    iVar8 = basic_substring<const_char>::compare(&pNVar11[uVar5].m_key.anchor,that,sz);
    if (iVar8 == 0) break;
    if ((uVar5 == 0xffffffffffffffff) || (pTVar4->m_cap <= uVar5)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar7 = is_debugger_attached(), bVar7)) {
        pcVar6 = (code *)swi(3);
        sVar9 = (*pcVar6)();
        return sVar9;
      }
      local_438[0] = '\0';
      local_438[1] = '\0';
      local_438[2] = '\0';
      local_438[3] = '\0';
      local_438[4] = '\0';
      local_438[5] = '\0';
      local_438[6] = '\0';
      local_438[7] = '\0';
      local_438[8] = -0x7a;
      local_438[9] = 'K';
      local_438[10] = '\0';
      local_438[0xb] = '\0';
      local_438[0xc] = '\0';
      local_438[0xd] = '\0';
      local_438[0xe] = '\0';
      local_438[0xf] = '\0';
      local_438[0x10] = '\0';
      local_438[0x11] = '\0';
      local_438[0x12] = '\0';
      local_438[0x13] = '\0';
      local_438[0x14] = '\0';
      local_438[0x15] = '\0';
      local_438[0x16] = '\0';
      local_438[0x17] = '\0';
      pcStack_420 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_418 = 0x65;
      (*(code *)PTR_error_impl_00247a78)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      pNVar11 = pTVar4->m_buf;
    }
    iVar8 = basic_substring<const_char>::compare(&pNVar11[uVar5].m_val.anchor,that,sz);
  } while (iVar8 != 0);
  return ra->node;
}

Assistant:

size_t lookup_(refdata *C4_RESTRICT ra)
    {
        RYML_ASSERT(ra->type.is_key_ref() || ra->type.is_val_ref());
        RYML_ASSERT(ra->type.is_key_ref() != ra->type.is_val_ref());
        csubstr refname;
        if(ra->type.is_val_ref())
        {
            refname = t->val_ref(ra->node);
        }
        else
        {
            RYML_ASSERT(ra->type.is_key_ref());
            refname = t->key_ref(ra->node);
        }
        while(ra->prev_anchor != npos)
        {
            ra = &refs[ra->prev_anchor];
            if(t->has_anchor(ra->node, refname))
                return ra->node;
        }

        #ifndef RYML_ERRMSG_SIZE
          #define RYML_ERRMSG_SIZE 1024
        #endif

        char errmsg[RYML_ERRMSG_SIZE];
        snprintf(errmsg, RYML_ERRMSG_SIZE, "anchor does not exist: '%.*s'",
                 static_cast<int>(refname.size()), refname.data());
        c4::yml::error(errmsg);
        return NONE;
    }